

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O1

void __thiscall
osqp::anon_unknown_0::TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test::TestBody
          (TwoDimensionalQpTest_SolvesWithNewObjectiveVector_Test *this)

{
  OsqpExitCode OVar1;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar2;
  undefined8 *puVar3;
  char *pcVar4;
  OsqpSolver *objective_vector_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr;
  Span<const_double> expected;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  VectorXd objective_vector;
  char *in_stack_ffffffffffffff68;
  AssertHelper local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  variable_if_dynamic<long,__1> __ptr_00;
  _Alloc_hider _Var5;
  variable_if_dynamic<long,__1> vVar6;
  undefined8 abs_error_expr;
  Matrix<double,__1,_1,_0,__1,_1> local_48;
  AssertHelper local_38;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_30;
  
  local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  free((void *)0x0);
  pMVar2 = (Matrix<double,__1,_1,_0,__1,_1> *)malloc(0x10);
  if (((ulong)pMVar2 & 0xf) != 0) {
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                  "void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pMVar2 == (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = execv;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  _Var5._M_p = (pointer)&local_48;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 2;
  vVar6.m_value = 0;
  abs_error_expr = (char *)0x1;
  (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       (double *)0x3ff0000000000000;
  local_88._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pMVar2;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&stack0xffffffffffffff88,
             (Scalar *)&local_88);
  if ((vVar6.m_value + 1U != *(long *)(_Var5._M_p + 8)) || ((char *)abs_error_expr != (char *)0x1))
  {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0
      && (Matrix<double,__1,_1,_0,__1,_1> *)
         local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
         (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  objective_vector_00 = &(this->super_TwoDimensionalQpTest).solver_;
  _Var5._M_p = (pointer)local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data;
  vVar6.m_value =
       local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  OsqpSolver::SetObjectiveVector
            ((OsqpSolver *)&local_90,
             (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
             objective_vector_00);
  local_88._M_head_impl._0_1_ =
       (internal)
       ((StatusRep *)CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) == (StatusRep *)0x1);
  __ptr_00.m_value = 0;
  if (((uint)local_90.data_ & 1) == 0) {
    absl::status_internal::StatusRep::Unref
              ((StatusRep *)CONCAT44(local_90.data_._4_4_,(uint)local_90.data_));
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffff80;
  free((void *)0x0);
  if (local_88._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&stack0xffffffffffffff88,(internal *)&local_88,
               (AssertionResult *)"solver_.SetObjectiveVector(objective_vector).ok()","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x171,_Var5._M_p);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((Matrix<double,__1,_1,_0,__1,_1> *)_Var5._M_p !=
        (Matrix<double,__1,_1,_0,__1,_1> *)&stack0xffffffffffffff98) {
      operator_delete(_Var5._M_p,(ulong)(abs_error_expr + 1));
    }
    if ((long *)CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(uint)local_90.data_) + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr_00.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00120ec9;
  }
  else {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr_00.m_value !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __ptr_00.m_value);
    }
    OVar1 = OsqpSolver::Solve(objective_vector_00);
    local_88._M_head_impl._0_4_ = OVar1;
    local_90.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<osqp::OsqpExitCode,osqp::OsqpExitCode>
              ((internal *)&stack0xffffffffffffff88,"solver_.Solve()","OsqpExitCode::kOptimal",
               (OsqpExitCode *)&local_88,(OsqpExitCode *)&local_90);
    if (SUB81(_Var5._M_p,0) != (internal)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vVar6.m_value !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffff90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vVar6.m_value);
      }
      OsqpSolver::objective_value(objective_vector_00);
      pcVar4 = "3 * kTolerance";
      testing::internal::DoubleNearPredFormat
                (in_stack_ffffffffffffff68,(char *)0x120cdf,(char *)abs_error_expr,
                 (double)vVar6.m_value,(double)_Var5._M_p,(double)__ptr_00.m_value);
      if (SUB81(_Var5._M_p,0) == (internal)0x0) {
        testing::Message::Message((Message *)&local_88);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vVar6.m_value ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = *(char **)vVar6.m_value;
        }
        pcVar4 = (char *)0x175;
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
                   ,0x175,message);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (local_88._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_88._M_head_impl + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vVar6.m_value !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffff90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     vVar6.m_value);
      }
      OsqpSolver::primal_solution(&local_30,objective_vector_00);
      expected.len_ = (size_type)pcVar4;
      expected.ptr_ = (pointer)0x2;
      ExpectElementsAre((anon_unknown_0 *)&local_30,
                        (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>
                         *)&stack0xffffffffffffff88,expected,1e-05);
      goto LAB_00120ec9;
    }
    testing::Message::Message((Message *)&local_88);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vVar6.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)vVar6.m_value;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/test/osqp++_test.cc"
               ,0x172,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    __ptr_00.m_value = vVar6.m_value;
    if (local_88._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_88._M_head_impl + 8))();
      __ptr_00.m_value = vVar6.m_value;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr_00.m_value ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_00120ec9;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&stack0xffffffffffffff90;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __ptr_00.m_value);
LAB_00120ec9:
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

TEST_F(TwoDimensionalQpTest, SolvesWithNewObjectiveVector) {
  // Changes the objective to x^2 + (1/2)xy + y^2 + x
  VectorXd objective_vector(2);
  objective_vector << 1.0, 0.0;
  ASSERT_TRUE(solver_.SetObjectiveVector(objective_vector).ok());
  ASSERT_EQ(solver_.Solve(), OsqpExitCode::kOptimal);

  EXPECT_NEAR(solver_.objective_value(), 1.0 - 0.5 * 0.25 + 0.25 * 0.25 + 1.0,
              3 * kTolerance);
  ExpectElementsAre(solver_.primal_solution(), {1.0, -0.25}, kTolerance);
}